

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Arena.cpp
# Opt level: O1

void __thiscall amrex::Arena::deallocate_system(Arena *this,void *p,size_t nbytes)

{
  if ((p != (void *)0x0) && ((this->arena_info).device_use_hostalloc == true)) {
    munlock(p,nbytes);
  }
  free(p);
  return;
}

Assistant:

void
Arena::deallocate_system (void* p, std::size_t nbytes)
{
#ifdef AMREX_USE_GPU
    if (arena_info.use_cpu_memory)
    {
        if (p && arena_info.device_use_hostalloc) AMREX_MUNLOCK(p, nbytes);
        std::free(p);
    }
    else if (arena_info.device_use_hostalloc)
    {
        AMREX_HIP_OR_CUDA_OR_DPCPP
            (AMREX_HIP_SAFE_CALL ( hipHostFree(p));,
             AMREX_CUDA_SAFE_CALL(cudaFreeHost(p));,
             sycl::free(p,Gpu::Device::syclContext()));
    }
    else
    {
        AMREX_HIP_OR_CUDA_OR_DPCPP
            (AMREX_HIP_SAFE_CALL ( hipFree(p));,
             AMREX_CUDA_SAFE_CALL(cudaFree(p));,
             sycl::free(p,Gpu::Device::syclContext()));
    }
#else
    if (p && arena_info.device_use_hostalloc) AMREX_MUNLOCK(p, nbytes);
    std::free(p);
#endif
}